

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O1

uint32_t PatchHandleArchipelago::inject_npc_addr_to_uuid_table(ROM *rom,RandomizerWorld *world)

{
  pointer ppIVar1;
  ItemSource *this;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  pointer puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  pointer ppIVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> npc_reward_addresses;
  ByteArray bytes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  string local_58;
  ROM *local_38;
  
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar7 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = rom;
  if (ppIVar7 != ppIVar1) {
    do {
      this = *ppIVar7;
      bVar3 = ItemSource::is_npc_reward(this);
      if (bVar3) {
        uVar5 = (ulong)*(byte *)((long)&this[1]._vptr_ItemSource + 4);
        if ((ulong)((long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar5) {
          local_58._M_dataplus._M_p._0_4_ = 0xffffffff;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&local_98,uVar5 + 1,(value_type_conflict5 *)&local_58);
        }
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = *(int *)&this[1]._vptr_ItemSource + 1;
      }
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != ppIVar1);
  }
  puVar2 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar6 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      ByteArray::add_long((ByteArray *)&local_78,*puVar6);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  ByteArray::add_long((ByteArray *)&local_78,0xffffffff);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  uVar4 = md::ROM::inject_bytes(local_38,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar4;
}

Assistant:

static uint32_t inject_npc_addr_to_uuid_table(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint32_t> npc_reward_addresses;
        for(ItemSource* source : world.item_sources())
        {
            if(!source->is_npc_reward())
                continue;
            ItemSourceReward* reward_source = reinterpret_cast<ItemSourceReward*>(source);

            uint8_t reward_id = reward_source->reward_id();
            if(npc_reward_addresses.size() <= reward_id)
                npc_reward_addresses.resize(reward_id+1, 0xFFFFFFFF);
            npc_reward_addresses[reward_id] = reward_source->address_in_rom() + 1;
        }

        ByteArray bytes;
        for(uint32_t addr : npc_reward_addresses)
            bytes.add_long(addr);
        bytes.add_long(0xFFFFFFFF);
        return rom.inject_bytes(bytes);
    }